

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconengine.cpp
# Opt level: O0

QPixmap * __thiscall
QIconEngine::scaledPixmap(QIconEngine *this,QSize *size,Mode mode,State state,qreal scale)

{
  undefined8 *in_RDX;
  QPixmap *in_RSI;
  ScaledPixmapArgument *in_RDI;
  long in_FS_OFFSET;
  ScaledPixmapArgument arg;
  ScaledPixmapArgument *this_00;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined8 local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = 0xffffffffffffffff;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  ScaledPixmapArgument::ScaledPixmapArgument(in_RDI);
  local_38 = (undefined1 *)*in_RDX;
  (*(in_RSI->super_QPaintDevice)._vptr_QPaintDevice[0xf])(in_RSI,4,&local_38);
  QPixmap::QPixmap((QPixmap *)this_00,in_RSI);
  ScaledPixmapArgument::~ScaledPixmapArgument((ScaledPixmapArgument *)0x29c79e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QPixmap *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QIconEngine::scaledPixmap(const QSize &size, QIcon::Mode mode, QIcon::State state, qreal scale)
{
    ScaledPixmapArgument arg;
    arg.size = size;
    arg.mode = mode;
    arg.state = state;
    arg.scale = scale;
    const_cast<QIconEngine *>(this)->virtual_hook(QIconEngine::ScaledPixmapHook, reinterpret_cast<void*>(&arg));
    return arg.pixmap;
}